

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O1

void __thiscall avro::Exception::Exception(Exception *this,format *msg)

{
  string_type local_38;
  
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (&local_38,msg);
  std::runtime_error::runtime_error((runtime_error *)&this->field_0x8,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this->_vptr_Exception = (_func_int **)0x1d9470;
  *(undefined8 *)&this->field_0x8 = 0x1d94a0;
  return;
}

Assistant:

Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }